

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

void __thiscall
SkeletalMesh::Scene::recursivelyGetTransf
          (Scene *this,SkeletonTransf *skTransf,SkeletonModifier *modifier,aiNode *node,
          aiMatrix4x4 parentTransf,aiMatrix4x4 *invTransf)

{
  char *pcVar1;
  pointer pmVar2;
  col_type *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  _Rb_tree_color _Var8;
  pointer pBVar9;
  pointer pmVar10;
  aiMatrix4x4 parentTransf_00;
  size_t sVar11;
  const_iterator cVar12;
  iterator iVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  key_type local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  char *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_128 = parentTransf._0_8_;
  local_188 = parentTransf._8_8_;
  local_138 = parentTransf._4_8_;
  uStack_130 = parentTransf._12_8_;
  uStack_180 = parentTransf._16_8_;
  local_158 = parentTransf._24_8_;
  local_118 = parentTransf._20_8_;
  uStack_110 = parentTransf._28_8_;
  uStack_150 = parentTransf._32_8_;
  local_168 = parentTransf._40_8_;
  local_f8 = parentTransf._36_8_;
  uStack_f0 = parentTransf._44_8_;
  uStack_160 = parentTransf._48_8_;
  local_a8._0_4_ = (node->mTransformation).a1;
  local_a8._4_4_ = (node->mTransformation).a2;
  uStack_a0._0_4_ = (node->mTransformation).a3;
  uStack_a0._4_4_ = (node->mTransformation).a4;
  local_c8._0_4_ = (node->mTransformation).b1;
  local_c8._4_4_ = (node->mTransformation).b2;
  uStack_c0._0_4_ = (node->mTransformation).b3;
  uStack_c0._4_4_ = (node->mTransformation).b4;
  local_98._0_4_ = (node->mTransformation).c1;
  local_98._4_4_ = (node->mTransformation).c2;
  uStack_90._0_4_ = (node->mTransformation).c3;
  uStack_90._4_4_ = (node->mTransformation).c4;
  local_88._0_4_ = (node->mTransformation).d1;
  local_88._4_4_ = (node->mTransformation).d2;
  uStack_80._0_4_ = (node->mTransformation).d3;
  uStack_80._4_4_ = (node->mTransformation).d4;
  pcVar1 = (node->mName).data;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  uStack_b0 = parentTransf._56_8_;
  local_e8 = ZEXT416((uint)parentTransf.d2);
  _local_178 = ZEXT416((uint)parentTransf.d3);
  uStack_120 = local_188;
  local_108 = uStack_180;
  uStack_100 = local_158;
  local_d8 = uStack_150;
  uStack_d0 = local_168;
  local_b8 = uStack_160;
  sVar11 = strlen(pcVar1);
  local_140 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,pcVar1,(node->mName).data + sVar11);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find(&(this->nameBoneMap)._M_t,&local_1a8);
  fVar24 = (float)local_188 * (float)local_98 +
           (float)local_128 * (float)local_a8 + (float)local_138 * (float)local_c8;
  fVar26 = (float)local_188 * local_98._4_4_ +
           (float)local_128 * local_a8._4_4_ + (float)local_138 * local_c8._4_4_;
  fVar28 = (float)local_188 * (float)uStack_90 +
           (float)local_128 * (float)uStack_a0 + (float)local_138 * (float)uStack_c0;
  fVar30 = (float)local_188 * uStack_90._4_4_ +
           (float)local_128 * uStack_a0._4_4_ + (float)local_138 * uStack_c0._4_4_;
  fVar32 = (float)local_158 * (float)local_98 +
           (float)local_108 * (float)local_a8 + (float)local_118 * (float)local_c8;
  fVar33 = (float)local_158 * local_98._4_4_ +
           (float)local_108 * local_a8._4_4_ + (float)local_118 * local_c8._4_4_;
  fVar35 = (float)local_158 * (float)uStack_90 +
           (float)local_108 * (float)uStack_a0 + (float)local_118 * (float)uStack_c0;
  fVar37 = (float)local_158 * uStack_90._4_4_ +
           (float)local_108 * uStack_a0._4_4_ + (float)local_118 * uStack_c0._4_4_;
  fVar39 = (float)local_168 * (float)local_98 +
           (float)local_d8 * (float)local_a8 + (float)local_f8 * (float)local_c8;
  fVar40 = (float)local_168 * local_98._4_4_ +
           (float)local_d8 * local_a8._4_4_ + (float)local_f8 * local_c8._4_4_;
  fVar41 = (float)local_168 * (float)uStack_90 +
           (float)local_d8 * (float)uStack_a0 + (float)local_f8 * (float)uStack_c0;
  fVar42 = (float)local_168 * uStack_90._4_4_ +
           (float)local_d8 * uStack_a0._4_4_ + (float)local_f8 * uStack_c0._4_4_;
  fVar43 = (float)local_178._0_4_ * (float)local_98 +
           (float)local_b8 * (float)local_a8 + (float)local_e8._0_4_ * (float)local_c8;
  fVar44 = (float)local_178._0_4_ * local_98._4_4_ +
           (float)local_b8 * local_a8._4_4_ + (float)local_e8._0_4_ * local_c8._4_4_;
  fVar45 = (float)local_178._0_4_ * (float)uStack_90 +
           (float)local_b8 * (float)uStack_a0 + (float)local_e8._0_4_ * (float)uStack_c0;
  fVar46 = (float)local_178._0_4_ * uStack_90._4_4_ +
           (float)local_b8 * uStack_a0._4_4_ + (float)local_e8._0_4_ * uStack_c0._4_4_;
  local_1b8 = parentTransf.a4;
  fVar15 = local_1b8 * (float)local_88;
  fStack_1b4 = local_1b8 * local_88._4_4_;
  fStack_1b0 = local_1b8 * (float)uStack_80;
  fStack_1ac = local_1b8 * uStack_80._4_4_;
  local_1c8 = parentTransf.b4;
  fVar16 = local_1c8 * (float)local_88;
  fStack_1c4 = local_1c8 * local_88._4_4_;
  fStack_1c0 = local_1c8 * (float)uStack_80;
  fStack_1bc = local_1c8 * uStack_80._4_4_;
  local_1d8 = parentTransf.c4;
  fVar19 = local_1d8 * (float)local_88;
  fStack_1d4 = local_1d8 * local_88._4_4_;
  fStack_1d0 = local_1d8 * (float)uStack_80;
  fStack_1cc = local_1d8 * uStack_80._4_4_;
  local_1e8 = parentTransf.d4 * (float)local_88;
  fStack_1e4 = parentTransf.d4 * local_88._4_4_;
  fStack_1e0 = parentTransf.d4 * (float)uStack_80;
  fStack_1dc = parentTransf.d4 * uStack_80._4_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    local_188 = (_Base_ptr)CONCAT44(fVar26,fVar24);
    uStack_180 = CONCAT44(fVar30,fVar28);
    local_158 = CONCAT44(fVar33,fVar32);
    uStack_150 = CONCAT44(fVar37,fVar35);
    local_168 = CONCAT44(fVar40,fVar39);
    uStack_160 = CONCAT44(fVar42,fVar41);
    local_178._4_4_ = fVar44;
    local_178._0_4_ = fVar43;
    fStack_170 = fVar45;
    fStack_16c = fVar46;
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    fVar24 = (float)local_188;
    fVar26 = local_188._4_4_;
    fVar28 = (float)uStack_180;
    fVar30 = uStack_180._4_4_;
    fVar32 = (float)local_158;
    fVar33 = local_158._4_4_;
    fVar35 = (float)uStack_150;
    fVar37 = uStack_150._4_4_;
    fVar39 = (float)local_168;
    fVar40 = local_168._4_4_;
    fVar41 = (float)uStack_160;
    fVar42 = uStack_160._4_4_;
    fVar43 = (float)local_178._0_4_;
    fVar44 = (float)local_178._4_4_;
    fVar45 = fStack_170;
    fVar46 = fStack_16c;
  }
  pcVar1 = local_140;
  local_1b8 = fVar15 + fVar24;
  fStack_1b4 = fStack_1b4 + fVar26;
  fStack_1b0 = fStack_1b0 + fVar28;
  fStack_1ac = fStack_1ac + fVar30;
  local_1c8 = fVar16 + fVar32;
  fStack_1c4 = fStack_1c4 + fVar33;
  fStack_1c0 = fStack_1c0 + fVar35;
  fStack_1bc = fStack_1bc + fVar37;
  local_1d8 = fVar19 + fVar39;
  fStack_1d4 = fStack_1d4 + fVar40;
  fStack_1d0 = fStack_1d0 + fVar41;
  fStack_1cc = fStack_1cc + fVar42;
  local_1e8 = local_1e8 + fVar43;
  fStack_1e4 = fStack_1e4 + fVar44;
  fStack_1e0 = fStack_1e0 + fVar45;
  fStack_1dc = fStack_1dc + fVar46;
  if ((_Rb_tree_header *)cVar12._M_node != &(this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header)
  {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_188 = cVar12;
    sVar11 = strlen(local_140);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pcVar1,pcVar1 + sVar11);
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>_>
             ::find(&modifier->_M_t,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar13._M_node != &(modifier->_M_t)._M_impl.super__Rb_tree_header) {
      fVar24 = *(float *)((long)&iVar13._M_node[3]._M_left + 4);
      fVar26 = *(float *)&iVar13._M_node[3].field_0x4;
      fVar28 = *(float *)((long)&iVar13._M_node[2]._M_left + 4);
      fVar30 = (float)iVar13._M_node[2]._M_color;
      fVar32 = *(float *)&iVar13._M_node[2].field_0x4;
      fVar33 = *(float *)&iVar13._M_node[2]._M_parent;
      fVar35 = *(float *)((long)&iVar13._M_node[2]._M_parent + 4);
      fVar15 = fStack_1b4 * fVar26;
      fVar16 = fStack_1b4 * fVar24;
      fVar37 = *(float *)&iVar13._M_node[3]._M_left;
      fVar39 = (float)iVar13._M_node[3]._M_color;
      fVar40 = *(float *)&iVar13._M_node[2]._M_left;
      fVar34 = local_1b8 * fVar40;
      fVar36 = local_1b8 * fVar39;
      fVar38 = local_1b8 * fVar37;
      fVar41 = *(float *)&iVar13._M_node[3]._M_right;
      fVar42 = *(float *)&iVar13._M_node[3]._M_parent;
      fVar43 = *(float *)&iVar13._M_node[2]._M_right;
      fVar19 = fStack_1b0 * fVar41;
      fVar44 = *(float *)((long)&iVar13._M_node[3]._M_right + 4);
      fVar45 = *(float *)((long)&iVar13._M_node[3]._M_parent + 4);
      fVar46 = *(float *)((long)&iVar13._M_node[2]._M_right + 4);
      local_1b8 = fStack_1ac * fVar35 +
                  fStack_1b0 * fVar33 + local_1b8 * fVar30 + fStack_1b4 * fVar32;
      fStack_1b4 = fStack_1ac * fVar46 + fStack_1b0 * fVar43 + fVar34 + fStack_1b4 * fVar28;
      fStack_1b0 = fStack_1ac * fVar45 + fStack_1b0 * fVar42 + fVar36 + fVar15;
      fStack_1ac = fStack_1ac * fVar44 + fVar19 + fVar38 + fVar16;
      fVar15 = fStack_1c4 * fVar26;
      fVar16 = fStack_1c4 * fVar24;
      fVar34 = local_1c8 * fVar40;
      fVar36 = local_1c8 * fVar39;
      fVar38 = local_1c8 * fVar37;
      fVar19 = fStack_1c0 * fVar41;
      local_1c8 = fStack_1bc * fVar35 +
                  fStack_1c0 * fVar33 + local_1c8 * fVar30 + fStack_1c4 * fVar32;
      fStack_1c4 = fStack_1bc * fVar46 + fStack_1c0 * fVar43 + fVar34 + fStack_1c4 * fVar28;
      fStack_1c0 = fStack_1bc * fVar45 + fStack_1c0 * fVar42 + fVar36 + fVar15;
      fStack_1bc = fStack_1bc * fVar44 + fVar19 + fVar38 + fVar16;
      fVar15 = fStack_1d4 * fVar26;
      fVar16 = fStack_1d4 * fVar24;
      fVar34 = local_1d8 * fVar40;
      fVar36 = local_1d8 * fVar39;
      fVar38 = local_1d8 * fVar37;
      fVar19 = fStack_1d0 * fVar41;
      local_1d8 = fStack_1cc * fVar35 +
                  fStack_1d0 * fVar33 + local_1d8 * fVar30 + fStack_1d4 * fVar32;
      fStack_1d4 = fStack_1cc * fVar46 + fStack_1d0 * fVar43 + fVar34 + fStack_1d4 * fVar28;
      fStack_1d0 = fStack_1cc * fVar45 + fStack_1d0 * fVar42 + fVar36 + fVar15;
      fStack_1cc = fStack_1cc * fVar44 + fVar19 + fVar38 + fVar16;
      fVar26 = fStack_1e4 * fVar26;
      fVar24 = fStack_1e4 * fVar24;
      fVar40 = local_1e8 * fVar40;
      fVar39 = local_1e8 * fVar39;
      fVar37 = local_1e8 * fVar37;
      fVar41 = fStack_1e0 * fVar41;
      local_1e8 = fStack_1dc * fVar35 +
                  fStack_1e0 * fVar33 + local_1e8 * fVar30 + fStack_1e4 * fVar32;
      fStack_1e4 = fStack_1dc * fVar46 + fStack_1e0 * fVar43 + fVar40 + fStack_1e4 * fVar28;
      fStack_1e0 = fStack_1dc * fVar45 + fStack_1e0 * fVar42 + fVar39 + fVar26;
      fStack_1dc = fStack_1dc * fVar44 + fVar41 + fVar37 + fVar24;
    }
    _Var8 = local_188[2]._M_color;
    pBVar9 = (this->skeleton).
             super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar10 = (skTransf->
              super__Vector_base<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    fVar24 = invTransf->b1;
    fVar26 = invTransf->b2;
    fVar28 = invTransf->b3;
    fVar30 = invTransf->b4;
    uVar4 = invTransf->a2;
    fVar32 = invTransf->c2;
    fVar33 = invTransf->d2;
    uVar5 = invTransf->a1;
    fVar35 = invTransf->c1;
    fVar37 = invTransf->d1;
    uVar6 = invTransf->a3;
    fVar39 = invTransf->c3;
    fVar40 = invTransf->d3;
    uVar7 = invTransf->a4;
    fVar41 = invTransf->c4;
    fVar42 = invTransf->d4;
    fVar15 = local_1e8 * (float)uVar7 +
             local_1d8 * (float)uVar6 + local_1b8 * (float)uVar5 + local_1c8 * (float)uVar4;
    fVar16 = local_1e8 * fVar30 + local_1d8 * fVar28 + local_1b8 * fVar24 + local_1c8 * fVar26;
    fVar19 = local_1e8 * fVar41 + local_1d8 * fVar39 + local_1b8 * fVar35 + local_1c8 * fVar32;
    fVar34 = local_1e8 * fVar42 + local_1d8 * fVar40 + local_1b8 * fVar37 + local_1c8 * fVar33;
    local_188 = (_Base_ptr)CONCAT44(fVar16,fVar15);
    uStack_180 = CONCAT44(fVar34,fVar19);
    fVar36 = fStack_1e4 * (float)uVar7 +
             fStack_1d4 * (float)uVar6 + fStack_1b4 * (float)uVar5 + fStack_1c4 * (float)uVar4;
    fVar38 = fStack_1e4 * fVar30 + fStack_1d4 * fVar28 + fStack_1b4 * fVar24 + fStack_1c4 * fVar26;
    fVar17 = fStack_1e4 * fVar41 + fStack_1d4 * fVar39 + fStack_1b4 * fVar35 + fStack_1c4 * fVar32;
    fVar18 = fStack_1e4 * fVar42 + fStack_1d4 * fVar40 + fStack_1b4 * fVar37 + fStack_1c4 * fVar33;
    fVar20 = fStack_1e0 * (float)uVar7 +
             fStack_1d0 * (float)uVar6 + fStack_1b0 * (float)uVar5 + fStack_1c0 * (float)uVar4;
    fVar21 = fStack_1e0 * fVar30 + fStack_1d0 * fVar28 + fStack_1b0 * fVar24 + fStack_1c0 * fVar26;
    fVar22 = fStack_1e0 * fVar41 + fStack_1d0 * fVar39 + fStack_1b0 * fVar35 + fStack_1c0 * fVar32;
    fVar23 = fStack_1e0 * fVar42 + fStack_1d0 * fVar40 + fStack_1b0 * fVar37 + fStack_1c0 * fVar33;
    fVar25 = fStack_1dc * (float)uVar7 +
             fStack_1cc * (float)uVar6 + fStack_1ac * (float)uVar5 + fStack_1bc * (float)uVar4;
    fVar27 = fStack_1dc * fVar30 + fStack_1cc * fVar28 + fStack_1ac * fVar24 + fStack_1bc * fVar26;
    fVar29 = fStack_1dc * fVar41 + fStack_1cc * fVar39 + fStack_1ac * fVar35 + fStack_1bc * fVar32;
    fVar31 = fStack_1dc * fVar42 + fStack_1cc * fVar40 + fStack_1ac * fVar37 + fStack_1bc * fVar33;
    fVar24 = pBVar9[_Var8].localTransf.b1;
    fVar26 = pBVar9[_Var8].localTransf.a1;
    fVar28 = pBVar9[_Var8].localTransf.a2;
    fVar30 = pBVar9[_Var8].localTransf.a3;
    fVar32 = pBVar9[_Var8].localTransf.a4;
    fVar33 = pBVar9[_Var8].localTransf.c1;
    fVar35 = pBVar9[_Var8].localTransf.d1;
    fVar37 = pBVar9[_Var8].localTransf.b2;
    fVar39 = pBVar9[_Var8].localTransf.c2;
    fVar40 = pBVar9[_Var8].localTransf.d2;
    fVar41 = pBVar9[_Var8].localTransf.b3;
    fVar42 = pBVar9[_Var8].localTransf.c3;
    fVar43 = pBVar9[_Var8].localTransf.d3;
    fVar44 = pBVar9[_Var8].localTransf.b4;
    fVar45 = pBVar9[_Var8].localTransf.c4;
    fVar46 = pBVar9[_Var8].localTransf.d4;
    pmVar2 = pmVar10 + _Var8;
    pmVar2->value[0].field_0.x =
         fVar35 * fVar25 + fVar33 * fVar20 + fVar26 * fVar15 + fVar24 * fVar36;
    pmVar2->value[0].field_1.y =
         fVar35 * fVar27 + fVar33 * fVar21 + fVar26 * fVar16 + fVar24 * fVar38;
    pmVar2->value[0].field_2.z =
         fVar35 * fVar29 + fVar33 * fVar22 + fVar26 * fVar19 + fVar24 * fVar17;
    pmVar2->value[0].field_3.w =
         fVar35 * fVar31 + fVar33 * fVar23 + fVar26 * fVar34 + fVar24 * fVar18;
    pcVar3 = pmVar10[_Var8].value + 1;
    (pcVar3->field_0).x = fVar40 * fVar25 + fVar39 * fVar20 + fVar28 * fVar15 + fVar37 * fVar36;
    (pcVar3->field_1).y = fVar40 * fVar27 + fVar39 * fVar21 + fVar28 * fVar16 + fVar37 * fVar38;
    (pcVar3->field_2).z = fVar40 * fVar29 + fVar39 * fVar22 + fVar28 * fVar19 + fVar37 * fVar17;
    (pcVar3->field_3).w = fVar40 * fVar31 + fVar39 * fVar23 + fVar28 * fVar34 + fVar37 * fVar18;
    pcVar3 = pmVar10[_Var8].value + 2;
    (pcVar3->field_0).x = fVar43 * fVar25 + fVar42 * fVar20 + fVar30 * fVar15 + fVar41 * fVar36;
    (pcVar3->field_1).y = fVar43 * fVar27 + fVar42 * fVar21 + fVar30 * fVar16 + fVar41 * fVar38;
    (pcVar3->field_2).z = fVar43 * fVar29 + fVar42 * fVar22 + fVar30 * fVar19 + fVar41 * fVar17;
    (pcVar3->field_3).w = fVar43 * fVar31 + fVar42 * fVar23 + fVar30 * fVar34 + fVar41 * fVar18;
    pcVar3 = pmVar10[_Var8].value + 3;
    (pcVar3->field_0).x = fVar46 * fVar25 + fVar45 * fVar20 + fVar32 * fVar15 + fVar44 * fVar36;
    (pcVar3->field_1).y = fVar46 * fVar27 + fVar45 * fVar21 + fVar32 * fVar16 + fVar44 * fVar38;
    (pcVar3->field_2).z = fVar46 * fVar29 + fVar45 * fVar22 + fVar32 * fVar19 + fVar44 * fVar17;
    (pcVar3->field_3).w = fVar46 * fVar31 + fVar45 * fVar23 + fVar32 * fVar34 + fVar44 * fVar18;
  }
  if (node->mNumChildren != 0) {
    uVar14 = 0;
    do {
      parentTransf_00.a2 = fStack_1b4;
      parentTransf_00.a1 = local_1b8;
      parentTransf_00.a4 = fStack_1ac;
      parentTransf_00.a3 = fStack_1b0;
      parentTransf_00.b2 = fStack_1c4;
      parentTransf_00.b1 = local_1c8;
      parentTransf_00.b4 = fStack_1bc;
      parentTransf_00.b3 = fStack_1c0;
      parentTransf_00.c2 = fStack_1d4;
      parentTransf_00.c1 = local_1d8;
      parentTransf_00.c4 = fStack_1cc;
      parentTransf_00.c3 = fStack_1d0;
      parentTransf_00.d1 = (float)(int)local_1e8._0_8_;
      parentTransf_00.d2 = (float)(int)((ulong)local_1e8._0_8_ >> 0x20);
      parentTransf_00.d3 = (float)(int)local_1e8._8_8_;
      parentTransf_00.d4 = (float)(int)((ulong)local_1e8._8_8_ >> 0x20);
      local_78 = local_1b8;
      fStack_74 = fStack_1b4;
      fStack_70 = fStack_1b0;
      fStack_6c = fStack_1ac;
      local_68 = local_1c8;
      fStack_64 = fStack_1c4;
      fStack_60 = fStack_1c0;
      fStack_5c = fStack_1bc;
      local_58 = local_1d8;
      fStack_54 = fStack_1d4;
      fStack_50 = fStack_1d0;
      fStack_4c = fStack_1cc;
      local_48 = local_1e8;
      uStack_44 = fStack_1e4;
      uStack_40 = fStack_1e0;
      uStack_3c = fStack_1dc;
      recursivelyGetTransf(this,skTransf,modifier,node->mChildren[uVar14],parentTransf_00,invTransf)
      ;
      uVar14 = uVar14 + 1;
    } while (uVar14 < node->mNumChildren);
  }
  return;
}

Assistant:

void recursivelyGetTransf(SkeletonTransf &skTransf, SkeletonModifier &modifier, aiNode *node,
                                  aiMatrix4x4 parentTransf, const aiMatrix4x4 &invTransf) const {
            aiMatrix4x4 globalTransf = parentTransf * node->mTransformation;
            Name2Bone::const_iterator boneFound = nameBoneMap.find(std::string(node->mName.data));
            if (boneFound != nameBoneMap.end()) {
                SkeletonModifier::const_iterator boneModFound = modifier.find(std::string(node->mName.data));
                aiMatrix4x4 boneMod;
                if (boneModFound != modifier.end()) {
                    auto trans = glm::transpose(boneModFound->second);
                    memcpy(&boneMod, &trans, 16 * sizeof(float));
                    globalTransf *= boneMod;
                }
                aiMatrix4x4 finalMtrx = invTransf * globalTransf * skeleton[boneFound->second].localTransf;
                memcpy(&skTransf[boneFound->second], &finalMtrx.Transpose(), sizeof(skTransf[boneFound->second]));
            }
            for (int i = 0; i < node->mNumChildren; i++) {
                recursivelyGetTransf(skTransf, modifier, node->mChildren[i], globalTransf, invTransf);
            }
        }